

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * i2b(int i)

{
  Bigint *b;
  Bigint *pBStack_10;
  int i_local;
  
  pBStack_10 = Balloc(1);
  if (pBStack_10 == (Bigint *)0x0) {
    pBStack_10 = (Bigint *)0x0;
  }
  else {
    pBStack_10->x[0] = i;
    pBStack_10->wds = 1;
  }
  return pBStack_10;
}

Assistant:

static Bigint *
i2b(int i)
{
    Bigint *b;

    b = Balloc(1);
    if (b == NULL)
        return NULL;
    b->x[0] = i;
    b->wds = 1;
    return b;
}